

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessTexturesTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::Textures::StorageMultisampleTest::Check<unsigned_char,2,false,3u>
          (StorageMultisampleTest *this)

{
  ulong uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  ulong uVar5;
  bool bVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  allocator_type local_29;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,0x30,&local_29);
  (**(code **)(lVar4 + 0xb8))(0x8c1a,this->m_to_aux);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glBindTexture has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd46);
  (**(code **)(lVar4 + 0xaa0))
            (0x8c1a,0,0x8228,0x1401,
             local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"glGetTexImage has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessTexturesTests.cpp"
                  ,0xd4a);
  if (*local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == '\0') {
    uVar1 = 0;
    do {
      uVar5 = uVar1;
      if (uVar5 == 0x2f) break;
      uVar1 = uVar5 + 1;
    } while (local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar5 + 1] == ""[uVar5 + 1]);
    bVar6 = 0x2e < uVar5;
  }
  else {
    bVar6 = false;
  }
  operator_delete(local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start,
                  (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_28.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return bVar6;
}

Assistant:

bool StorageMultisampleTest::Check()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Fetching data fro auxiliary texture. */
	std::vector<T> result(TestReferenceDataCount<S, D>());

	gl.bindTexture(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, m_to_aux);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture has failed");

	gl.getTexImage(InputTextureTarget<D>() /* Auxiliary target is the same as input. */, 0, Format<S, N>(), Type<T>(),
				   (glw::GLvoid*)(&result[0]));
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetTexImage has failed");

	/* Comparison. */
	for (glw::GLuint i = 0; i < TestReferenceDataCount<S, D>(); ++i)
	{
		if (!Compare<T>(result[i], ReferenceData<T, N>()[i]))
		{
			return false;
		}
	}

	return true;
}